

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

bool __thiscall minihttp::HttpSocket::_EnqueueOrSend(HttpSocket *this,Request *req,bool forceQueue)

{
  bool bVar1;
  
  if ((forceQueue | this->_inProgress) == 1) {
    std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::push_back
              (&(this->_requestQ).c,req);
    bVar1 = true;
  }
  else {
    bVar1 = _OpenRequest(this,req);
    if (bVar1) {
      bVar1 = TcpSocket::SendBytes
                        (&this->super_TcpSocket,(req->header)._M_dataplus._M_p,
                         (uint)(req->header)._M_string_length);
      this->_inProgress = bVar1;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool HttpSocket::_EnqueueOrSend(const Request& req, bool forceQueue /* = false */)
{
    traceprint("HttpSocket::_EnqueueOrSend, forceQueue = %d\n", forceQueue);
    if(_inProgress || forceQueue) // do not send while receiving other data
    {
        traceprint("HTTP: Transfer pending; putting into queue. Now %u waiting.\n", (unsigned int)_requestQ.size());
        _requestQ.push(req);
        return true;
    }
    // ok, we can send directly
    traceprint("HTTP: Open request for immediate send.\n");
    if(!_OpenRequest(req))
        return false;
    bool sent = SendBytes(req.header.c_str(), req.header.length());
    _inProgress = sent;
    return sent;
}